

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O1

void just_test_test_case_f_test_path_is_not_empty(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  directory d;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  assert_not_equal local_68;
  directory local_40;
  
  just::temp::directory::directory(&local_40);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,"");
  paVar1 = &local_68._assert_msg._filename.field_2;
  local_68._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a0 + (long)local_a8);
  local_68._assert_msg._line = 0x2f;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_40._path._M_dataplus._M_p,
             local_40._path._M_dataplus._M_p + local_40._path._M_string_length);
  just::test::assert_not_equal::operator()(&local_68,"",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._assert_msg._filename._M_dataplus._M_p,
                    local_68._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  just::temp::directory::~directory(&local_40);
  return;
}

Assistant:

JUST_TEST_CASE(test_path_is_not_empty)
{
  const temp::directory d;

  JUST_ASSERT_NOT_EQUAL("", d.path());
}